

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerInlineeStart(Lowerer *this,Instr *inlineeStartInstr)

{
  OpCode OVar1;
  Instr *pIVar2;
  Instr *pIVar3;
  code *pcVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  StackSym *pSVar7;
  SymOpnd *pSVar8;
  JITTimeFunctionBody *this_00;
  Instr *pIVar9;
  AddrOpnd *src;
  IntConstOpnd *pIVar10;
  Opnd *this_01;
  int iVar11;
  Instr *pIVar12;
  undefined4 *local_40;
  
  this_01 = inlineeStartInstr->m_src2;
  if (this_01 == (Opnd *)0x0) {
    if ((inlineeStartInstr->m_func->field_0x240 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3903,"(inlineeStartInstr->m_func->m_hasInlineArgsOpt)",
                         "inlineeStartInstr->m_func->m_hasInlineArgsOpt");
      if (!bVar5) goto LAB_005604a3;
      *puVar6 = 0;
    }
    pIVar9 = inlineeStartInstr->m_prev;
  }
  else {
    if (inlineeStartInstr->m_func->firstActualStackOffset == -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3907,"(inlineeStartInstr->m_func->firstActualStackOffset != -1)",
                         "This should have been already done in backward pass");
      if (!bVar5) goto LAB_005604a3;
      *puVar6 = 0;
      this_01 = inlineeStartInstr->m_src2;
    }
    pSVar7 = IR::Opnd::GetStackSym(this_01);
    pIVar9 = (pSVar7->field_5).m_instrDef;
    if ((pIVar9 != (Instr *)0x0 & pSVar7->field_0x18) == 1) {
      local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *local_40 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                         ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar5) goto LAB_005604a3;
      *local_40 = 0;
      pIVar9 = (pSVar7->field_5).m_instrDef;
    }
    do {
      if ((pIVar9->m_src2 == (Opnd *)0x0) || (bVar5 = IR::Opnd::IsSymOpnd(pIVar9->m_src2), !bVar5))
      {
LAB_00560140:
        pIVar12 = (Instr *)0x0;
      }
      else {
        pSVar8 = IR::Opnd::AsSymOpnd(pIVar9->m_src2);
        pSVar7 = Sym::AsStackSym(pSVar8->m_sym);
        bVar5 = StackSym::IsArgSlotSym(pSVar7);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
          if (!bVar5) goto LAB_005604a3;
          *local_40 = 0;
        }
        if (((((pSVar7->field_0x18 & 1) == 0) || ((pSVar7->field_5).m_instrDef == (Instr *)0x0)) &&
            (bVar5 = Func::IsInPhase(inlineeStartInstr->m_func,FGPeepsPhase), !bVar5)) &&
           (bVar5 = Func::IsInPhase(inlineeStartInstr->m_func,FGBuildPhase), !bVar5)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1bf,
                             "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                             ,
                             "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                            );
          if (!bVar5) goto LAB_005604a3;
          *local_40 = 0;
        }
        if ((pSVar7->field_0x18 & 1) == 0) goto LAB_00560140;
        pIVar12 = (pSVar7->field_5).m_instrDef;
      }
      OVar1 = pIVar9->m_opcode;
      if ((OVar1 == ArgOut_A) || (OVar1 == ArgOut_A_Inline)) {
LAB_005601aa:
        IR::Opnd::GetStackSym(pIVar9->m_src2);
        IR::Instr::FreeSrc2(pIVar9);
        sourceContextId = Func::GetSourceContextId(this->m_func);
        functionId = Func::GetLocalFunctionId(this->m_func);
        bVar5 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01447bf0,EliminateArgoutForInlineePhase,sourceContextId,
                           functionId);
        if (bVar5) {
          this_00 = Func::GetJITFunctionBody(inlineeStartInstr->m_func);
          bVar5 = JITTimeFunctionBody::HasOrParentHasArguments(this_00);
          if (!bVar5) {
            pIVar9->m_opcode = ArgOut_A_InlineBuiltIn;
            goto LAB_0056020a;
          }
        }
        LowererMD::ChangeToAssign(pIVar9);
      }
      else if (OVar1 != ArgOut_A_InlineSpecialized) {
        if (OVar1 != StartCall) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x390c,
                             "(argInstr->m_opcode == Js::OpCode::ArgOut_A || argInstr->m_opcode == Js::OpCode::ArgOut_A_Inline)"
                             ,
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A || argInstr->m_opcode == Js::OpCode::ArgOut_A_Inline"
                            );
          if (bVar5) {
            *local_40 = 0;
            goto LAB_005601aa;
          }
          goto LAB_005604a3;
        }
        if (pIVar12 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar5) goto LAB_005604a3;
          *local_40 = 0;
        }
        break;
      }
LAB_0056020a:
      pIVar9 = pIVar12;
    } while (pIVar12 != (Instr *)0x0);
    pIVar9 = inlineeStartInstr;
    if (inlineeStartInstr->m_opcode != InlineeStart) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                         ,0x1e8,"(this->m_opcode == Js::OpCode::InlineeStart)",
                         "this->m_opcode == Js::OpCode::InlineeStart");
      if (!bVar5) {
LAB_005604a3:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    for (; pIVar9->m_opcode != InlineeMetaArg; pIVar9 = pIVar9->m_prev) {
    }
    do {
      pIVar12 = pIVar9;
      pIVar9 = pIVar12->m_prev;
    } while (pIVar9->m_opcode == InlineeMetaArg);
    iVar11 = 1;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pIVar9 = inlineeStartInstr;
    while (pIVar12->m_opcode == InlineeMetaArg) {
      pIVar2 = pIVar12->m_next;
      if (iVar11 == 1) {
        pSVar8 = Func::GetNextInlineeFrameArgCountSlotOpnd(pIVar12->m_func);
        src = IR::AddrOpnd::NewNull(pIVar12->m_func);
        InsertMove(&pSVar8->super_Opnd,&src->super_Opnd,pIVar9,true);
      }
      else if (iVar11 == 0) {
        IR::Instr::SetSrc1(pIVar12,inlineeStartInstr->m_src1);
      }
      IR::Instr::Unlink(pIVar12);
      IR::Instr::InsertBefore(pIVar9,pIVar12);
      pIVar3 = pIVar12->m_prev;
      LowererMD::ChangeToAssign(pIVar12);
      pIVar9 = pIVar12;
      if (iVar11 == 1) {
        pIVar9 = pIVar3->m_next;
        if (pIVar9 != pIVar12) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x3931,"(metaArg == prev->m_next)","metaArg == prev->m_next");
          if (!bVar5) goto LAB_005604a3;
          *puVar6 = 0;
          pIVar9 = pIVar3->m_next;
        }
        pIVar10 = IR::Opnd::AsIntConstOpnd(pIVar9->m_src1);
        if (pIVar10->m_dontEncode == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x3936,"(metaArg->GetSrc1()->AsIntConstOpnd()->m_dontEncode == true)",
                             "metaArg->GetSrc1()->AsIntConstOpnd()->m_dontEncode == true");
          if (!bVar5) goto LAB_005604a3;
          *puVar6 = 0;
        }
        pIVar9->field_0x36 = pIVar9->field_0x36 | 0x20;
        LowererMD::Legalize<false>(pIVar9,false);
      }
      iVar11 = iVar11 + -1;
      pIVar12 = pIVar2;
    }
    pIVar9 = inlineeStartInstr->m_prev;
    if (((inlineeStartInstr->m_func->field_0x240 & 2) == 0) &&
       ((inlineeStartInstr->m_func->parentFunc->field_0x240 & 2) == 0)) {
      IR::Instr::Remove(inlineeStartInstr);
    }
    else {
      IR::Instr::FreeSrc1(inlineeStartInstr);
      IR::Instr::FreeSrc2(inlineeStartInstr);
      IR::Instr::FreeDst(inlineeStartInstr);
    }
  }
  return pIVar9;
}

Assistant:

IR::Instr *
Lowerer::LowerInlineeStart(IR::Instr * inlineeStartInstr)
{
    IR::Opnd *linkOpnd   = inlineeStartInstr->GetSrc2();
    if (!linkOpnd)
    {
        Assert(inlineeStartInstr->m_func->m_hasInlineArgsOpt);
        return inlineeStartInstr->m_prev;
    }

    AssertMsg(inlineeStartInstr->m_func->firstActualStackOffset != -1, "This should have been already done in backward pass");

    IR::Instr *startCall;
    // Free the argOut links and lower them to MOVs
    inlineeStartInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A || argInstr->m_opcode == Js::OpCode::ArgOut_A_Inline);
        startCall = argInstr->GetSrc2()->GetStackSym()->m_instrDef;
        argInstr->FreeSrc2();
#pragma prefast(suppress:6235, "Non-Zero Constant in Condition")
        if (!PHASE_ON(Js::EliminateArgoutForInlineePhase, this->m_func) || inlineeStartInstr->m_func->GetJITFunctionBody()->HasOrParentHasArguments())
        {
            m_lowererMD.ChangeToAssign(argInstr);
        }
        else
        {
            argInstr->m_opcode = Js::OpCode::ArgOut_A_InlineBuiltIn;
        }

        return false;
    });

    IR::Instr *argInsertInstr = inlineeStartInstr;
    uint i = 0;
    inlineeStartInstr->IterateMetaArgs( [&] (IR::Instr* metaArg)
    {
        if(i == 0)
        {
            Lowerer::InsertMove(metaArg->m_func->GetNextInlineeFrameArgCountSlotOpnd(),
                IR::AddrOpnd::NewNull(metaArg->m_func),
                argInsertInstr);
        }
        if (i == Js::Constants::InlineeMetaArgIndex_FunctionObject)
        {
            metaArg->SetSrc1(inlineeStartInstr->GetSrc1());
        }
        metaArg->Unlink();
        argInsertInstr->InsertBefore(metaArg);
        IR::Instr* prev = metaArg->m_prev;
        m_lowererMD.ChangeToAssign(metaArg);
        if (i == Js::Constants::InlineeMetaArgIndex_Argc)
        {
#if defined(_M_IX86) || defined(_M_X64)
            Assert(metaArg == prev->m_next);
#else //defined(_M_ARM)
            Assert(prev->m_next->m_opcode == Js::OpCode::LDIMM);
#endif
            metaArg = prev->m_next;
            Assert(metaArg->GetSrc1()->AsIntConstOpnd()->m_dontEncode == true);
            metaArg->isInlineeEntryInstr = true;
            LowererMD::Legalize(metaArg);
        }
        argInsertInstr = metaArg;
        i++;
        return false;
    });

    IR::Instr* prev = inlineeStartInstr->m_prev;

    if (inlineeStartInstr->m_func->m_hasInlineArgsOpt || inlineeStartInstr->m_func->GetParentFunc()->m_hasInlineArgsOpt)
    {
        inlineeStartInstr->FreeSrc1();
        inlineeStartInstr->FreeSrc2();
        inlineeStartInstr->FreeDst();
    }
    else
    {
        inlineeStartInstr->Remove();
    }

    return prev;
}